

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::GeneratedCodeInfo::SerializeWithCachedSizes
          (GeneratedCodeInfo *this,CodedOutputStream *output)

{
  int iVar1;
  void *pvVar2;
  Type *value;
  int index;
  
  iVar1 = (this->annotation_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      value = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
                        (&(this->annotation_).super_RepeatedPtrFieldBase,index);
      internal::WireFormatLite::WriteMessageMaybeToArray(1,(MessageLite *)value,output);
      index = index + 1;
    } while (iVar1 != index);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    return;
  }
  internal::WireFormat::SerializeUnknownFields
            ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),output);
  return;
}

Assistant:

void GeneratedCodeInfo::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.GeneratedCodeInfo)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
  for (unsigned int i = 0, n = this->annotation_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      1, this->annotation(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.GeneratedCodeInfo)
}